

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_server.hpp
# Opt level: O2

tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_bool>
 __thiscall
pstore::http::
socket_read<pstore::http::buffered_reader<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char,_1l>const&)>&,pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(&)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
          (http *this,
          buffered_reader<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
          *reader,_func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
                  *sender,
          reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
          io,not_null<pstore::http::ws_command_*> command)

{
  uint uVar1;
  bool bVar2;
  tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_pstore::http::frame>
  *ptVar3;
  reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_> io_00;
  _Head_base<0UL,_std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_false>
  extraout_RDX;
  error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
  *__return_storage_ptr__;
  close_status_code cVar4;
  not_null<pstore::http::ws_command_*> wsp;
  error_code eVar5;
  error_code eVar6;
  tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_bool>
  tVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_168;
  error_or_n<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_frame>
  eo;
  error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
  local_118;
  error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
  local_100;
  error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
  local_e8;
  error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
  local_d0;
  error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
  local_b8;
  error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
  local_a0;
  storage_type<pstore::gsl::details::extent_type<_1L>_> local_88;
  error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
  local_78;
  error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
  local_60;
  error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
  local_48;
  
  wsp.ptr_ = command.ptr_;
  read_frame<pstore::http::buffered_reader<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char,_1l>const&)>,std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
            (&eo,(http *)reader,
             (buffered_reader<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
              *)io._M_data,
             (reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
              )io._M_data);
  if (eo.has_error_ == true) {
    eVar5 = error_or<std::tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_pstore::http::frame>_>
            ::get_error(&eo);
    cVar4 = (close_status_code)wsp.ptr_;
    (**(code **)(*(long *)eVar5._M_cat + 0x20))(&bStack_168,eVar5._M_cat,eVar5._M_value);
    log<std::__cxx11::string>(error,"Error: ",&bStack_168);
    std::__cxx11::string::~string((string *)&bStack_168);
    eVar5 = error_or<std::tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_pstore::http::frame>_>
            ::get_error(&eo);
    eVar6 = make_error_code(unmasked_frame);
    if (eVar5._M_value == eVar6._M_value && eVar5._M_cat == eVar6._M_cat) {
      __return_storage_ptr__ = &local_48;
      send_close_frame<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
                (__return_storage_ptr__,(http *)sender,
                 (_func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
                  *)io._M_data,
                 (reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                  )0x3ea,cVar4);
    }
    else {
      eVar6 = make_error_code(reserved_bit_set);
      if (eVar5._M_value == eVar6._M_value && eVar5._M_cat == eVar6._M_cat) {
        __return_storage_ptr__ = &local_60;
        send_close_frame<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
                  (__return_storage_ptr__,(http *)sender,
                   (_func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
                    *)io._M_data,
                   (reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                    )0x3ea,cVar4);
      }
      else {
        __return_storage_ptr__ = &local_78;
        send_close_frame<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
                  (__return_storage_ptr__,(http *)sender,
                   (_func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
                    *)io._M_data,
                   (reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                    )0x3ee,cVar4);
      }
    }
    goto LAB_001214bb;
  }
  ptVar3 = error_or<std::tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>,pstore::http::frame>>
           ::
           value_storage_impl<pstore::error_or<std::tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>,pstore::http::frame>>const&,std::tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>,pstore::http::frame>const>
                     (&eo);
  io._M_data = (ptVar3->
               super__Tuple_impl<0UL,_std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_pstore::http::frame>
               ).
               super__Head_base<0UL,_std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_false>
               ._M_head_impl._M_data;
  io_00._M_data =
       (descriptor<pstore::details::posix_descriptor_traits> *)
       error_or<std::tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>,pstore::http::frame>>
       ::
       value_storage_impl<pstore::error_or<std::tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>,pstore::http::frame>>const&,std::tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>,pstore::http::frame>const>
                 (&eo);
  uVar1 = (io_00._M_data)->fd_;
  cVar4 = (close_status_code)wsp.ptr_;
  if (((uVar1 & 8) != 0) &&
     (((io_00._M_data)->field_0x4 != '\x01' ||
      (0x7d < (ulong)((long)io_00._M_data[2] - (long)io_00._M_data[1]))))) {
    send_close_frame<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
              (&local_a0,(http *)sender,
               (_func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
                *)io._M_data,
               (reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                )0x3ea,cVar4);
    __return_storage_ptr__ = &local_a0;
    goto LAB_001214bb;
  }
  switch(uVar1) {
  case 0:
    if (((command.ptr_)->op & close) != continuation) {
      send_close_frame<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
                (&local_b8,(http *)sender,
                 (_func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
                  *)io._M_data,
                 (reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                  )0x3ea,cVar4);
      __return_storage_ptr__ = &local_b8;
      goto LAB_001214bb;
    }
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&(command.ptr_)->payload,
               (const_iterator)
               ((command.ptr_)->payload).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish,
               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )*(uchar **)(io_00._M_data + 1),
               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )*(uchar **)(io_00._M_data + 2));
    bVar2 = check_message_complete<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
                      (sender,io,(frame *)io_00._M_data,&(command.ptr_)->op,&(command.ptr_)->payload
                      );
LAB_0012162b:
    if (bVar2 != false) break;
    goto LAB_001214c0;
  case 1:
  case 2:
    if (((command.ptr_)->op == unknown) &&
       (((command.ptr_)->payload).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        ((command.ptr_)->payload).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish)) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&(command.ptr_)->payload,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(io_00._M_data + 1));
      (command.ptr_)->op = (io_00._M_data)->fd_;
      bVar2 = check_message_complete<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
                        (sender,io,(frame *)io_00._M_data,&(command.ptr_)->op,
                         &(command.ptr_)->payload);
      goto LAB_0012162b;
    }
    send_close_frame<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
              (&local_d0,(http *)sender,
               (_func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
                *)io._M_data,
               (reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                )0x3ea,cVar4);
    __return_storage_ptr__ = &local_d0;
    goto LAB_001214bb;
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
    send_close_frame<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
              (&local_e8,(http *)sender,
               (_func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
                *)io._M_data,
               (reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                )0x3ea,cVar4);
    __return_storage_ptr__ = &local_e8;
    goto LAB_001214bb;
  case 8:
    close_message<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
              (&local_100,(http *)sender,
               (_func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
                *)io._M_data,io_00,(frame *)wsp.ptr_);
    __return_storage_ptr__ = &local_100;
LAB_001214bb:
    error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
    ::~error_or(__return_storage_ptr__);
LAB_001214c0:
    *this = (http)0x1;
    goto LAB_001214c3;
  case 9:
    local_88 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
               pstore::gsl::make_span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          (io_00._M_data + 1));
    pong<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
              (&local_118,(http *)sender,
               (_func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
                *)io._M_data,(descriptor<pstore::details::posix_descriptor_traits> *)&local_88,
               (span<const_unsigned_char,__1L> *)wsp.ptr_);
    error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
    ::~error_or(&local_118);
    break;
  case 10:
    break;
  default:
    if (uVar1 == 0xff) {
      assert_failed("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/http/ws_server.hpp"
                    ,0x237);
    }
  }
  *this = (http)0x0;
LAB_001214c3:
  *(descriptor<pstore::details::posix_descriptor_traits> **)(this + 8) = io._M_data;
  error_or<std::tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_pstore::http::frame>_>
  ::~error_or(&eo);
  tVar7.
  super__Tuple_impl<0UL,_std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_bool>
  .
  super__Head_base<0UL,_std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_false>
  ._M_head_impl._M_data = extraout_RDX._M_head_impl._M_data;
  tVar7.
  super__Tuple_impl<0UL,_std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_bool>
  ._0_8_ = this;
  return (tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_bool>
          )tVar7.
           super__Tuple_impl<0UL,_std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_bool>
  ;
}

Assistant:

std::tuple<IO, bool> socket_read (Reader && reader, Sender && sender, IO io,
                                          gsl::not_null<ws_command *> const command) {
            error_or_n<IO, frame> const eo = read_frame (reader, io);
            if (!eo) {
                log (logger::priority::error, "Error: ", eo.get_error ().message ());
                auto const error = eo.get_error ();
                if (error == make_error_code (ws_error::unmasked_frame)) {
                    // "The server MUST close the connection upon receiving a frame that is not
                    // masked.  In this case, a server MAY send a Close frame with a status code
                    // of 1002 (protocol error)."
                    send_close_frame (sender, io, close_status_code::protocol_error);
                } else if (error == make_error_code (ws_error::reserved_bit_set)) {
                    send_close_frame (sender, io, close_status_code::protocol_error);
                } else {
                    send_close_frame (sender, io, close_status_code::abnormal_closure);
                }
                return std::tuple<IO, bool>{std::move (io), true};
            }

            io = get<0> (eo);
            frame const & wsp = get<1> (eo);

            // "All control frames MUST have a payload length of 125 bytes or less and MUST
            // NOT be fragmented."
            if (is_control_frame_opcode (wsp.op) && (!wsp.fin || wsp.payload.size () > 125)) {
                send_close_frame (sender, io, close_status_code::protocol_error);
                return std::tuple<IO, bool>{std::move (io), true};
            }

            switch (wsp.op) {
            case opcode::continuation:
                if (is_control_frame_opcode (command->op)) {
                    send_close_frame (sender, io, close_status_code::protocol_error);
                    return std::tuple<IO, bool>{std::move (io), true};
                }
                command->payload.insert (std::end (command->payload), std::begin (wsp.payload),
                                         std::end (wsp.payload));
                if (!check_message_complete (sender, io, wsp, command->op, command->payload)) {
                    return std::tuple<IO, bool>{std::move (io), true};
                }
                break;

            // Data frame opcodes.
            case opcode::text:
            case opcode::binary:
                // We didn't see a FIN frame before a new data frame.
                if (command->op != opcode::unknown || !command->payload.empty ()) {
                    send_close_frame (sender, io, close_status_code::protocol_error);
                    return std::tuple<IO, bool>{std::move (io), true};
                }

                command->payload = std::move (wsp.payload);
                command->op = wsp.op;
                if (!check_message_complete (sender, io, wsp, command->op, command->payload)) {
                    return std::tuple<IO, bool>{std::move (io), true};
                }
                break;

            case opcode::reserved_nc_1:
            case opcode::reserved_nc_2:
            case opcode::reserved_nc_3:
            case opcode::reserved_nc_4:
            case opcode::reserved_nc_5:
            case opcode::reserved_control_1:
            case opcode::reserved_control_2:
            case opcode::reserved_control_3:
            case opcode::reserved_control_4:
            case opcode::reserved_control_5:
                send_close_frame (sender, io, close_status_code::protocol_error);
                return std::tuple<IO, bool>{std::move (io), true};

            case opcode::close:
                close_message (sender, io, wsp);
                return std::tuple<IO, bool>{std::move (io), true};

            case opcode::ping: pong (sender, io, gsl::make_span (wsp.payload)); break;

            case opcode::pong:
                // TODO: A reply to a ping that we sent.
                break;

            case opcode::unknown: PSTORE_ASSERT (0); break;
            }
            return std::tuple<IO, bool>{std::move (io), false};
        }